

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O1

void __thiscall gv_visitor::visit(gv_visitor *this,BiggerExpr *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *pEVar2;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,">","");
  box(this,ptr,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pEVar2 = ptr->first;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"left","");
  arrow(this,ptr,pEVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  pEVar2 = ptr->second;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"right","");
  arrow(this,ptr,pEVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->second->super_Base)._vptr_Base)(ptr->second,this);
  return;
}

Assistant:

void gv_visitor::visit(BiggerExpr* ptr) {
    box(ptr, ">");
    arrow(ptr, ptr->first, "left");
    ptr->first->accept(this);
    arrow(ptr, ptr->second, "right");
    ptr->second->accept(this);
}